

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeVertexArrayApiTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::draw_elements_base_vertex_invalid_map
               (NegativeTestContext *ctx)

{
  GLuint buf;
  GLfloat vertices [1];
  GLuint local_40;
  undefined1 local_3c [4];
  string local_38;
  
  local_40 = 0;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,
             "GL_INVALID_OPERATION is generated if a non-zero buffer object name is bound to an enabled array or the element array and the buffer object\'s data store is currently mapped."
             ,"");
  NegativeTestContext::beginSection(ctx,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glGenBuffers(&ctx->super_CallLogWrapper,1,&local_40);
  glu::CallLogWrapper::glBindBuffer(&ctx->super_CallLogWrapper,0x8893,local_40);
  glu::CallLogWrapper::glBufferData(&ctx->super_CallLogWrapper,0x8893,10,(void *)0x0,0x88e4);
  glu::CallLogWrapper::glMapBufferRange(&ctx->super_CallLogWrapper,0x8893,0,5,1);
  NegativeTestContext::expectError(ctx,0);
  glu::CallLogWrapper::glDrawElementsBaseVertex(&ctx->super_CallLogWrapper,0,1,0x1405,local_3c,1);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glUnmapBuffer(&ctx->super_CallLogWrapper,0x8893);
  glu::CallLogWrapper::glDeleteBuffers(&ctx->super_CallLogWrapper,1,&local_40);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void draw_elements_base_vertex_invalid_map (NegativeTestContext& ctx)
{
	GLuint	buf = 0;
	GLfloat	vertices[1];

	ctx.beginSection("GL_INVALID_OPERATION is generated if a non-zero buffer object name is bound to an enabled array or the element array and the buffer object's data store is currently mapped.");
	ctx.glGenBuffers(1, &buf);
	ctx.glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, buf);
	ctx.glBufferData(GL_ELEMENT_ARRAY_BUFFER, 10, 0, GL_STATIC_DRAW);
	ctx.glMapBufferRange(GL_ELEMENT_ARRAY_BUFFER, 0, 5, GL_MAP_READ_BIT);
	ctx.expectError(GL_NO_ERROR);
	ctx.glDrawElementsBaseVertex(GL_POINTS, 1, GL_UNSIGNED_INT, vertices, 1);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUnmapBuffer(GL_ELEMENT_ARRAY_BUFFER);
	ctx.glDeleteBuffers(1, &buf);
	ctx.endSection();
}